

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_rounding.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_415d::FlexFloatNearestRoundingTest_DoubleNeg_Test::TestBody
          (FlexFloatNearestRoundingTest_DoubleNeg_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> ff_val;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  undefined1 local_48 [8];
  flexfloat_desc_t fStack_40;
  undefined6 uStack_3e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_28;
  
  fesetround(0);
  local_28.v.value = 0.0;
  local_28.v.desc.exp_bits = '\x03';
  local_28.v.desc.frac_bits = '\x03';
  local_48 = (undefined1  [8])0xc02e000000000000;
  fStack_40.exp_bits = '\x03';
  fStack_40.frac_bits = '\x03';
  flexfloat_sanitize((flexfloat_t *)local_48);
  local_28.v._10_6_ = uStack_3e;
  local_28.v.desc = fStack_40;
  local_28.v.value = (fp_t)local_48;
  bitstring<(unsigned_char)3,(unsigned_char)3>((string *)local_48,&local_28);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            (local_58,"\"1-110-111\"","bitstring(ff_val)",(char (*) [10])"1-110-111",
             (string *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/nearest_rounding.cpp"
               ,0xa8,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST(FlexFloatNearestRoundingTest, DoubleNeg) {
    fesetround(FE_TONEAREST);
    const double val = -15;
    flexfloat<3, 3> ff_val;
    ff_val = val;
    EXPECT_EQ("1-110-111", bitstring(ff_val));
}